

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **argv_00;
  long lVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  unsigned_long ul;
  unsigned_long local_38;
  
  progname = *argv;
  uVar2 = str_len(progname);
  if (uVar2 != 0) {
    lVar4 = (long)(int)uVar2;
    do {
      if (progname[lVar4 + -1] == '/') {
        progname = progname + lVar4;
        break;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (*progname == 'd') {
    progname = progname + 1;
  }
  pcVar6 = progname;
  iVar3 = str_diff(progname,"setuidgid");
  if (iVar3 == 0) {
    setuidgid((int)pcVar6,argv);
  }
  pcVar6 = progname;
  iVar3 = str_diff(progname,"envuidgid");
  if (iVar3 == 0) {
    envuidgid((int)pcVar6,argv);
  }
  pcVar6 = progname;
  iVar3 = str_diff(progname,"envdir");
  if (iVar3 == 0) {
    envdir((int)pcVar6,argv);
  }
  pcVar6 = progname;
  iVar3 = str_diff(progname,"pgrphack");
  if (iVar3 == 0) {
    pgrphack((int)pcVar6,argv);
  }
  iVar3 = str_diff(progname,"setlock");
  if (iVar3 == 0) {
    setlock(argc,argv);
    pcVar6 = argv[1];
    if (pcVar6 == (char *)0x0) {
      strerr_die(100,"usage: ",progname," account child","\n",(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    }
    if (argv[2] == (char *)0x0) {
      strerr_die(100,"usage: ",progname," account child","\n",(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    }
    suidgid(pcVar6,0);
    pathexec(argv + 2);
    strerr_die(0x6f,"chpst: fatal: ","unable to run",": ",argv[2],": ",(char *)0x0,&strerr_sys);
    return extraout_EAX;
  }
  iVar3 = str_diff(progname,"softlimit");
  if (iVar3 == 0) {
    softlimit(argc,argv);
  }
  iVar3 = sgetoptmine(argc,argv,"u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V");
  if (iVar3 != subgetoptdone) {
    do {
      pcVar6 = subgetoptarg;
      switch(iVar3) {
      case 0x4c:
        if (lock != (char *)0x0) {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        lock = subgetoptarg;
        lockdelay = 0;
        break;
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x71:
      case 0x73:
        break;
      case 0x50:
        pgrp = 1;
        break;
      case 0x55:
        env_user = subgetoptarg;
        break;
      case 0x56:
        strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                    (strerr *)0x0);
LAB_001041e7:
        strerr_die(100,"usage: ",progname,
                   " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                   ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        break;
      case 0x62:
        argv0 = subgetoptarg;
        break;
      case 99:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitc = local_38;
        break;
      case 100:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitd = local_38;
        break;
      case 0x65:
        env_dir = subgetoptarg;
        break;
      case 0x66:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitf = local_38;
        break;
      case 0x6c:
        if (lock != (char *)0x0) {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        lock = subgetoptarg;
        lockdelay = 1;
        break;
      case 0x6d:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitd = local_38;
        limita = local_38;
        limitl = local_38;
        limits = local_38;
        break;
      case 0x6e:
        if (*subgetoptarg == '+') {
          subgetoptarg = subgetoptarg + 1;
        }
        else if (*subgetoptarg == '-') {
          subgetoptarg = subgetoptarg + 1;
          uVar2 = scan_ulong(subgetoptarg,&local_38);
          if (pcVar6[(ulong)uVar2 + 1] != '\0') {
            strerr_die(100,"usage: ",progname,
                       " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                       ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
          }
          nicelvl = -local_38;
          break;
        }
        pcVar6 = subgetoptarg;
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        nicelvl = local_38;
        break;
      case 0x6f:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limito = local_38;
        break;
      case 0x70:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitp = local_38;
        break;
      case 0x72:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitr = local_38;
        break;
      case 0x74:
        uVar2 = scan_ulong(subgetoptarg,&local_38);
        if (pcVar6[uVar2] != '\0') {
          strerr_die(100,"usage: ",progname,
                     " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
                     ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
        }
        limitt = local_38;
        break;
      case 0x75:
        set_user = subgetoptarg;
        break;
      case 0x76:
        verbose = 1;
        break;
      default:
        switch(iVar3) {
        case 0x2f:
          root = subgetoptarg;
          break;
        case 0x30:
          nostdin = 1;
          break;
        case 0x31:
          nostdout = 1;
          break;
        case 0x32:
          nostderr = 1;
          break;
        default:
          if (iVar3 == 0x3f) goto LAB_001041e7;
        }
      }
      iVar3 = sgetoptmine(argc,argv,"u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V");
    } while (iVar3 != subgetoptdone);
  }
  lVar4 = (long)subgetoptind;
  if (argv[lVar4] == (char *)0x0) {
    strerr_die(100,"usage: ",progname,
               " [-vP012] [-u user[:group]] [-U user[:group]] [-b argv0] [-e dir] [-/ root] [-n nice] [-l|-L lock] [-m n] [-d n] [-o n] [-p n] [-f n] [-c n] prog"
               ,"\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  if (pgrp != 0) {
    setsid();
  }
  if (env_dir != (char *)0x0) {
    edir(env_dir);
  }
  if (root != (char *)0x0) {
    iVar3 = chdir(root);
    if (iVar3 == -1) {
      strerr_die(0x6f,"chpst: fatal: ","unable to change directory",": ",root,": ",(char *)0x0,
                 &strerr_sys);
    }
    iVar3 = chroot(".");
    if (iVar3 == -1) {
      strerr_die(0x6f,"chpst: fatal: ","unable to change root directory",": ",(char *)0x0,
                 (char *)0x0,(char *)0x0,&strerr_sys);
    }
  }
  lVar1 = nicelvl;
  if (nicelvl != 0) {
    piVar5 = __errno_location();
    *piVar5 = 0;
    iVar3 = nice((int)lVar1);
    if ((iVar3 == -1) && (*piVar5 != 0)) {
      strerr_die(0x6f,"chpst: fatal: ","unable to set nice level",": ",(char *)0x0,(char *)0x0,
                 (char *)0x0,&strerr_sys);
    }
  }
  if (env_user != (char *)0x0) {
    euidgid(env_user,1);
  }
  if (set_user != (char *)0x0) {
    suidgid(set_user,1);
  }
  if (lock != (char *)0x0) {
    slock(lock,lockdelay,0);
  }
  if ((nostdin != 0) && (iVar3 = close(0), iVar3 == -1)) {
    strerr_die(0x6f,"chpst: fatal: ","unable to close stdin",": ",(char *)0x0,(char *)0x0,
               (char *)0x0,&strerr_sys);
  }
  if ((nostdout != 0) && (iVar3 = close(1), iVar3 == -1)) {
    strerr_die(0x6f,"chpst: fatal: ","unable to close stdout",": ",(char *)0x0,(char *)0x0,
               (char *)0x0,&strerr_sys);
  }
  argv_00 = argv + lVar4;
  if ((nostderr != 0) && (iVar3 = close(2), iVar3 == -1)) {
    strerr_die(0x6f,"chpst: fatal: ","unable to close stderr",": ",(char *)0x0,(char *)0x0,
               (char *)0x0,&strerr_sys);
  }
  slimit();
  progname = *argv_00;
  if (argv0 != (char *)0x0) {
    *argv_00 = argv0;
  }
  pathexec_env_run(progname,argv_00);
  strerr_die(0x6f,"chpst: fatal: ","unable to run",": ",*argv_00,": ",(char *)0x0,&strerr_sys);
  return 0;
}

Assistant:

int main(int argc, const char **argv) {
  int opt;
  int i;
  unsigned long ul;

  progname =argv[0];
  for (i =str_len(progname); i; --i)
    if (progname[i -1] == '/') {
      progname +=i;
      break;
    }
  if (progname[0] == 'd') ++progname;

  /* argv[0] */
  if (str_equal(progname, "setuidgid")) setuidgid(argc, argv);
  if (str_equal(progname, "envuidgid")) envuidgid(argc, argv);
  if (str_equal(progname, "envdir")) envdir(argc, argv);
  if (str_equal(progname, "pgrphack")) pgrphack(argc, argv);
  if (str_equal(progname, "setlock")) setlock(argc, argv);
  if (str_equal(progname, "softlimit")) softlimit(argc, argv);

  while ((opt =getopt(argc, argv, "u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V"))
         != opteof)
    switch(opt) {
    case 'u': set_user =(char*)optarg; break;
    case 'U': env_user =(char*)optarg; break;
    case 'b': argv0 =(char*)optarg; break;
    case 'e': env_dir =optarg; break;
    case 'm':
      if (optarg[scan_ulong(optarg, &ul)]) usage();
      limits =limitl =limita =limitd =ul;
      break;
    case 'd': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitd =ul; break;
    case 'o': if (optarg[scan_ulong(optarg, &ul)]) usage(); limito =ul; break;
    case 'p': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitp =ul; break;
    case 'f': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitf =ul; break;
    case 'c': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitc =ul; break;
    case 'r': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitr =ul; break;
    case 't': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitt =ul; break;
    case '/': root =optarg; break;
    case 'n':
      switch (*optarg) {
        case '-':
          ++optarg; /* about ordering safety.... */
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          nicelvl *=-1;
          break;
        case '+': ++optarg;
        default:
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          break;
      }
      break;
    case 'l': if (lock) usage(); lock =optarg; lockdelay =1; break;
    case 'L': if (lock) usage(); lock =optarg; lockdelay =0; break;
    case 'v': verbose =1; break;
    case 'P': pgrp =1; break;
    case '0': nostdin =1; break;
    case '1': nostdout =1; break;
    case '2': nostderr =1; break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if (pgrp) setsid();
  if (env_dir) edir(env_dir);
  if (root) {
    if (chdir(root) == -1) fatal2("unable to change directory", root);
    if (chroot(".") == -1) fatal("unable to change root directory");
  }
  if (nicelvl) {
    errno =0;
    if (nice(nicelvl) == -1) if (errno) fatal("unable to set nice level");
  }
  if (env_user) euidgid(env_user, 1);
  if (set_user) suidgid(set_user, 1);
  if (lock) slock(lock, lockdelay, 0);
  if (nostdin) if (close(0) == -1) fatal("unable to close stdin");
  if (nostdout) if (close(1) == -1) fatal("unable to close stdout");
  if (nostderr) if (close(2) == -1) fatal("unable to close stderr");
  slimit();

  progname =*argv;
  if (argv0) *argv =argv0;
  pathexec_env_run(progname, argv);
  fatal2("unable to run", *argv);
  return(0);
}